

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_routing_linux.c
# Opt level: O3

int os_routing_linux_query(os_route *route)

{
  uint32_t uVar1;
  int iVar2;
  uint8_t buffer [1024];
  nlmsghdr local_418;
  uchar local_408;
  
  if (((route->cb_finished == (_func_void_os_route_ptr_int *)0x0) ||
      (route->cb_get == (_func_void_os_route_ptr_os_route_ptr *)0x0)) &&
     (((&log_global_mask)[_oonf_os_routing_subsystem.logging] & 8) != 0)) {
    oonf_log(8,(ulong)_oonf_os_routing_subsystem.logging,"src/base/os_linux/os_routing_linux.c",
             0x11d,0,0,"illegal route query");
    abort();
  }
  iVar2 = 0;
  memset(&local_418,0,0x400);
  local_418.nlmsg_len = 0x11;
  local_418.nlmsg_type = 0x1a;
  local_418.nlmsg_flags = 0x301;
  local_408 = (route->p).family;
  uVar1 = os_system_linux_netlink_send(&_rtnetlink_socket,&local_418);
  if ((int)uVar1 < 0) {
    iVar2 = -1;
  }
  else {
    (route->_internal).nl_seq = uVar1;
    (route->_internal)._node.key = &(route->_internal).nl_seq;
    avl_insert(&_rtnetlink_feedback,&route->_internal);
  }
  return iVar2;
}

Assistant:

int
os_routing_linux_query(struct os_route *route) {
  uint8_t buffer[UIO_MAXIOV];
  struct nlmsghdr *msg;
  struct rtgenmsg *rt_gen;
  int seq;

  OONF_ASSERT(route->cb_finished != NULL && route->cb_get != NULL, LOG_OS_ROUTING, "illegal route query");
  memset(buffer, 0, sizeof(buffer));

  /* get pointers for netlink message */
  msg = (void *)&buffer[0];
  rt_gen = NLMSG_DATA(msg);

  msg->nlmsg_flags = NLM_F_REQUEST | NLM_F_DUMP;

  /* set length of netlink message with rtmsg payload */
  msg->nlmsg_len = NLMSG_LENGTH(sizeof(*rt_gen));

  msg->nlmsg_type = RTM_GETROUTE;
  rt_gen->rtgen_family = route->p.family;

  seq = os_system_linux_netlink_send(&_rtnetlink_socket, msg);
  if (seq < 0) {
    return -1;
  }

  route->_internal.nl_seq = seq;
  route->_internal._node.key = &route->_internal.nl_seq;
  avl_insert(&_rtnetlink_feedback, &route->_internal._node);
  return 0;
}